

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O3

void cf_cbc_decrypt(cf_cbc *ctx,uint8_t *input,uint8_t *output,size_t blocks)

{
  size_t __n;
  size_t sVar1;
  uint8_t buf [16];
  byte local_48 [24];
  
  if (blocks != 0) {
    __n = ctx->prp->blocksz;
    do {
      (*ctx->prp->decrypt)(ctx->prpctx,input,local_48);
      if (__n != 0) {
        sVar1 = 0;
        do {
          output[sVar1] = ctx->block[sVar1] ^ local_48[sVar1];
          sVar1 = sVar1 + 1;
        } while (__n != sVar1);
      }
      blocks = blocks - 1;
      memcpy(ctx->block,input,__n);
      input = input + __n;
      output = output + __n;
    } while (blocks != 0);
  }
  return;
}

Assistant:

void cf_cbc_decrypt(cf_cbc *ctx, const uint8_t *input, uint8_t *output, size_t blocks)
{
  uint8_t buf[CF_MAXBLOCK];
  size_t nblk = ctx->prp->blocksz;

  while (blocks--)
  {
    ctx->prp->decrypt(ctx->prpctx, input, buf);
    xor_bb(output, buf, ctx->block, nblk);
    memcpy(ctx->block, input, nblk);
    input += nblk;
    output += nblk;
  }
}